

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int magma_get_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  uchar iv [16];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  *(undefined4 *)(lVar2 + 8) = 0x2000;
  iVar1 = gost2015_get_asn1_params(params,0xc,(uchar *)&local_28,4,(uchar *)(lVar2 + 0xc));
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    puVar3 = (undefined4 *)EVP_CIPHER_CTX_iv_noconst(ctx);
    *puVar3 = local_28;
    puVar3[1] = uStack_24;
    puVar3[2] = uStack_20;
    puVar3[3] = uStack_1c;
    puVar4 = (undefined8 *)EVP_CIPHER_CTX_original_iv(ctx);
    *puVar4 = CONCAT44(uStack_24,local_28);
    puVar4[1] = CONCAT44(uStack_1c,uStack_20);
    *(undefined4 *)(lVar2 + 8) = 0x2000;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int magma_get_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
  struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
	unsigned char iv[16];

	c->key_meshing = 8192;

	if (gost2015_get_asn1_params(params, MAGMA_UKM_LEN, iv, 4, c->kdf_seed) < 0)
	    return -1;

	memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), iv, sizeof(iv));
	memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv, sizeof(iv));
	/* Key meshing 8 kb*/
	c->key_meshing = 8192;

	return 1;
}